

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O2

void __thiscall
slang::ast::SequenceConcatExpr::visitExprs<hgdb::rtl::ExpressionPrinter&>
          (SequenceConcatExpr *this,ExpressionPrinter *visitor)

{
  AssertionExpr *this_00;
  Element *elem;
  pointer pEVar1;
  long lVar2;
  
  pEVar1 = (this->elements).data_;
  for (lVar2 = (this->elements).size_ * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    this_00 = not_null<const_slang::ast::AssertionExpr_*>::get(&pEVar1->sequence);
    AssertionExpr::visit<hgdb::rtl::ExpressionPrinter>(this_00,visitor);
    pEVar1 = pEVar1 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& elem : elements)
            elem.sequence->visit(visitor);
    }